

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegAtomPtr xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  xmlRegRangePtr pxVar1;
  xmlRegQuantType xVar2;
  int iVar3;
  int iVar4;
  xmlRegAtomPtr atom_00;
  xmlRegRangePtr *ppxVar5;
  xmlRegRangePtr pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  
  atom_00 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
  if (atom_00 == (xmlRegAtomPtr)0x0) {
    ctxt->error = 2;
    atom_00 = (xmlRegAtomPtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
  }
  else {
    atom_00->ranges = (xmlRegRangePtr *)0x0;
    atom_00->data = (void *)0x0;
    atom_00->stop = (xmlRegStatePtr)0x0;
    atom_00->maxRanges = 0;
    atom_00->nbRanges = 0;
    atom_00->start = (xmlRegStatePtr)0x0;
    atom_00->start0 = (xmlRegStatePtr)0x0;
    atom_00->valuep2 = (void *)0x0;
    atom_00->neg = 0;
    atom_00->codepoint = 0;
    *(undefined8 *)&atom_00->max = 0;
    atom_00->valuep = (void *)0x0;
    atom_00->no = 0;
    atom_00->type = 0;
    atom_00->quant = 0;
    atom_00->min = 0;
    xVar2 = atom->quant;
    iVar3 = atom->min;
    iVar4 = atom->max;
    atom_00->type = atom->type;
    atom_00->quant = xVar2;
    atom_00->min = iVar3;
    atom_00->max = iVar4;
    if (0 < (long)atom->nbRanges) {
      ppxVar5 = (xmlRegRangePtr *)(*xmlMalloc)((long)atom->nbRanges << 3);
      atom_00->ranges = ppxVar5;
      if (ppxVar5 == (xmlRegRangePtr *)0x0) {
        ctxt->error = 2;
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                            (xmlError *)0x0);
LAB_0017de3e:
        xmlRegFreeAtom(atom_00);
        atom_00 = (xmlRegAtomPtr)0x0;
      }
      else if (0 < atom->nbRanges) {
        lVar8 = 0;
        do {
          pxVar1 = atom->ranges[lVar8];
          if ((pxVar1 == (xmlRegRangePtr)0x0) ||
             (pxVar6 = xmlRegNewRange(ctxt,pxVar1->neg,pxVar1->type,pxVar1->start,pxVar1->end),
             pxVar6 == (xmlRegRangePtr)0x0)) {
LAB_0017ddd8:
            pxVar6 = (xmlRegRangePtr)0x0;
          }
          else if (pxVar1->blockName != (xmlChar *)0x0) {
            pxVar7 = xmlStrdup(pxVar1->blockName);
            pxVar6->blockName = pxVar7;
            if (pxVar7 == (xmlChar *)0x0) {
              ctxt->error = 2;
              xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                  0xe,(xmlError *)0x0);
              if (pxVar6->blockName != (xmlChar *)0x0) {
                (*xmlFree)(pxVar6->blockName);
              }
              (*xmlFree)(pxVar6);
              goto LAB_0017ddd8;
            }
          }
          atom_00->ranges[lVar8] = pxVar6;
          if (atom_00->ranges[lVar8] == (xmlRegRangePtr)0x0) goto LAB_0017de3e;
          lVar8 = lVar8 + 1;
          atom_00->nbRanges = (int)lVar8;
        } while (lVar8 < atom->nbRanges);
      }
    }
  }
  return atom_00;
}

Assistant:

static xmlRegAtomPtr
xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = atom->type;
    ret->quant = atom->quant;
    ret->min = atom->min;
    ret->max = atom->max;
    if (atom->nbRanges > 0) {
        int i;

        ret->ranges = (xmlRegRangePtr *) xmlMalloc(sizeof(xmlRegRangePtr) *
	                                           atom->nbRanges);
	if (ret->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    goto error;
	}
	for (i = 0;i < atom->nbRanges;i++) {
	    ret->ranges[i] = xmlRegCopyRange(ctxt, atom->ranges[i]);
	    if (ret->ranges[i] == NULL)
	        goto error;
	    ret->nbRanges = i + 1;
	}
    }
    return(ret);

error:
    xmlRegFreeAtom(ret);
    return(NULL);
}